

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles::_InternalParse
          (TensorValue_RepeatedDoubles *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  double *local_48;
  uint local_3c;
  TensorValue_RepeatedDoubles *local_38;
  
  local_48 = (double *)ptr;
  local_38 = this;
LAB_001af1fd:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (double *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    if ((local_3c & 0xfffffff8) == 8) {
      if (local_3c != 10) {
        if (local_3c != 9) goto LAB_001af263;
        _internal_add_values(local_38,*local_48);
        local_48 = local_48 + 1;
        goto LAB_001af1fd;
      }
      local_48 = (double *)
                 google::protobuf::internal::PackedDoubleParser(&this->values_,(char *)local_48,ctx)
      ;
    }
    else {
LAB_001af263:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return (char *)local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_48 = (double *)
                 google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_48,ctx);
    }
    if (local_48 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* TensorValue_RepeatedDoubles::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated double values = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_values(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 9) {
          _internal_add_values(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}